

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

Float * __thiscall blc::math::Float::operator=(Float *this,Float *other)

{
  int iVar1;
  Float *in_RSI;
  Float *in_RDI;
  double dVar2;
  
  dVar2 = getNb(in_RSI);
  in_RDI->_nb = dVar2;
  iVar1 = getE(in_RSI);
  in_RDI->_E = iVar1;
  setNb(in_RSI,0.0);
  setE(in_RSI,0);
  return in_RDI;
}

Assistant:

blc::math::Float &blc::math::Float::operator=(blc::math::Float &&other) {
	this->_nb = other.getNb();
	this->_E = other.getE();

	other.setNb(0);
	other.setE(0);
	return (*this);
}